

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

void __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::clear
          (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  reference pvVar1;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  
  delete_root_subtree(this);
  detail::basic_node_ptr<unodb::detail::node_header>::operator=(&this->root,(nullptr_t)0x0);
  this->current_memory_use = 0;
  pvVar1 = std::array<unsigned_long,_5UL>::operator[](&this->node_counts,1);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_long,_5UL>::operator[](&this->node_counts,2);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_long,_5UL>::operator[](&this->node_counts,3);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_long,_5UL>::operator[](&this->node_counts,4);
  *pvVar1 = 0;
  return;
}

Assistant:

void db<Key, Value>::clear() noexcept {
  delete_root_subtree();

  root = nullptr;
#ifdef UNODB_DETAIL_WITH_STATS
  current_memory_use = 0;
  node_counts[as_i<node_type::I4>] = 0;
  node_counts[as_i<node_type::I16>] = 0;
  node_counts[as_i<node_type::I48>] = 0;
  node_counts[as_i<node_type::I256>] = 0;
#endif  // UNODB_DETAIL_WITH_STATS
}